

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_scaling_list(bs_t *b,int *scalingList,int sizeOfScalingList,
                       int *useDefaultScalingMatrixFlag)

{
  int local_38;
  int j;
  int delta_scale;
  int nextScale;
  int lastScale;
  int *useDefaultScalingMatrixFlag_local;
  int sizeOfScalingList_local;
  int *scalingList_local;
  bs_t *b_local;
  
  delta_scale = 8;
  j = 8;
  for (local_38 = 0; local_38 < sizeOfScalingList; local_38 = local_38 + 1) {
    if (j != 0) {
      j = scalingList[local_38];
      if (*useDefaultScalingMatrixFlag != 0) {
        j = 0;
      }
      bs_write_se(b,(j - delta_scale) % 0x100);
    }
    delta_scale = scalingList[local_38];
  }
  return;
}

Assistant:

void write_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 1 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            bs_write_se(b, delta_scale);

            if( 0 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 0 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}